

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O3

bool __thiscall
HighsSplitDeque::leapfrogStolenTask(HighsSplitDeque *this,HighsTask *task,HighsSplitDeque **stealer)

{
  ulong uVar1;
  HighsTask *task_00;
  
  uVar1 = (task->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
  if ((uVar1 & 1) == 0) {
    if (uVar1 < 4) {
      do {
        uVar1 = (task->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
      } while ((uVar1 & 0xfffffffffffffffd) == 0);
    }
    if ((uVar1 & 1) == 0) {
      *stealer = (HighsSplitDeque *)(uVar1 & 0xfffffffffffffffc);
      if ((HighsSplitDeque *)(uVar1 & 0xfffffffffffffffc) == (HighsSplitDeque *)0x0) {
        return true;
      }
      uVar1 = uVar1 & 2;
      while ((uVar1 == 0 && (task_00 = stealWithRetryLoop(*stealer), task_00 != (HighsTask *)0x0)))
      {
        runStolenTask(this,task_00);
        uVar1 = (task->metadata).stealer.super___atomic_base<unsigned_long>._M_i & 1;
      }
      return (bool)((byte)(task->metadata).stealer.super___atomic_base<unsigned_long>._M_i & 1);
    }
  }
  *stealer = (HighsSplitDeque *)0x0;
  return true;
}

Assistant:

bool leapfrogStolenTask(HighsTask* task, HighsSplitDeque*& stealer) {
    bool cancelled;
    stealer = task->getStealerIfUnfinished(&cancelled);

    if (stealer == nullptr) return true;

    if (!cancelled) {
      do {
        HighsTask* t = stealer->stealWithRetryLoop();
        if (t == nullptr) break;
        runStolenTask(t);
      } while (!task->isFinished());
    }

    return task->isFinished();
  }